

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O3

void __thiscall
QRhiResourceUpdateBatchPrivate::free(QRhiResourceUpdateBatchPrivate *this,void *__ptr)

{
  quint64 *pqVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  QDebug QVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  QRhiBufferData *this_00;
  ulong uVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QDebug local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (this->bufferOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>.
          super_QVLABaseBase.s;
  if (lVar2 == 0) {
    uVar7 = 0;
    uVar9 = 0;
  }
  else {
    lVar6 = 0;
    uVar9 = 0;
    uVar7 = 0;
    do {
      lVar3 = *(long *)((long)(this->bufferOps).
                              super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>.
                              super_QVLABaseBase.ptr + lVar6 + 0x18);
      if (lVar3 == 0) {
        iVar8 = 0;
      }
      else {
        uVar9 = uVar9 + *(int *)(lVar3 + 4);
        iVar8 = *(int *)(lVar3 + 0x18);
      }
      uVar7 = uVar7 + iVar8;
      lVar6 = lVar6 + 0x30;
    } while (lVar2 * 0x30 != lVar6);
  }
  QtPrivateLogging::QRHI_LOG_RUB();
  if (((byte)QtPrivateLogging::QRHI_LOG_RUB::category.field_2.bools.enabledDebug._q_value._M_base.
             _M_i & 1) != 0) {
    QMessageLogger::debug();
    QVar5.stream = local_50.stream;
    QVar11.m_data = (storage_type *)0x21;
    QVar11.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar11);
    QTextStream::operator<<(&(QVar5.stream)->ts,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if ((local_50.stream)->space == true) {
      QTextStream::operator<<(&(local_50.stream)->ts,' ');
    }
    QTextStream::operator<<(&(local_50.stream)->ts,this->poolIndex);
    if ((local_50.stream)->space == true) {
      QTextStream::operator<<(&(local_50.stream)->ts,' ');
    }
    QVar5.stream = local_50.stream;
    QVar12.m_data = (storage_type *)0x12;
    QVar12.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar12);
    QTextStream::operator<<(&(QVar5.stream)->ts,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if ((local_50.stream)->space == true) {
      QTextStream::operator<<(&(local_50.stream)->ts,' ');
    }
    QTextStream::operator<<(&(local_50.stream)->ts,this->activeBufferOpCount);
    if ((local_50.stream)->space == true) {
      QTextStream::operator<<(&(local_50.stream)->ts,' ');
    }
    QVar5.stream = local_50.stream;
    QVar13.m_data = (storage_type *)0x2;
    QVar13.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar13);
    QTextStream::operator<<(&(QVar5.stream)->ts,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if ((local_50.stream)->space == true) {
      QTextStream::operator<<(&(local_50.stream)->ts,' ');
    }
    QTextStream::operator<<
              (&(local_50.stream)->ts,
               (this->bufferOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>.
               super_QVLABaseBase.s);
    if ((local_50.stream)->space == true) {
      QTextStream::operator<<(&(local_50.stream)->ts,' ');
    }
    QVar5.stream = local_50.stream;
    QVar14.m_data = (storage_type *)0x4;
    QVar14.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar14);
    QTextStream::operator<<(&(QVar5.stream)->ts,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if ((local_50.stream)->space == true) {
      QTextStream::operator<<(&(local_50.stream)->ts,' ');
    }
    QTextStream::operator<<(&(local_50.stream)->ts,uVar9);
    if ((local_50.stream)->space == true) {
      QTextStream::operator<<(&(local_50.stream)->ts,' ');
    }
    QVar5.stream = local_50.stream;
    QVar15.m_data = (storage_type *)0xa;
    QVar15.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar15);
    QTextStream::operator<<(&(QVar5.stream)->ts,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if ((local_50.stream)->space == true) {
      QTextStream::operator<<(&(local_50.stream)->ts,' ');
    }
    QTextStream::operator<<(&(local_50.stream)->ts,uVar7);
    if ((local_50.stream)->space == true) {
      QTextStream::operator<<(&(local_50.stream)->ts,' ');
    }
    QVar5.stream = local_50.stream;
    QVar16.m_data = (storage_type *)0x11;
    QVar16.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar16);
    QTextStream::operator<<(&(QVar5.stream)->ts,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if ((local_50.stream)->space == true) {
      QTextStream::operator<<(&(local_50.stream)->ts,' ');
    }
    QTextStream::operator<<(&(local_50.stream)->ts,this->activeTextureOpCount);
    if ((local_50.stream)->space == true) {
      QTextStream::operator<<(&(local_50.stream)->ts,' ');
    }
    QVar5.stream = local_50.stream;
    QVar17.m_data = (storage_type *)0x2;
    QVar17.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar17);
    QTextStream::operator<<(&(QVar5.stream)->ts,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if ((local_50.stream)->space == true) {
      QTextStream::operator<<(&(local_50.stream)->ts,' ');
    }
    QTextStream::operator<<
              (&(local_50.stream)->ts,
               (this->textureOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::TextureOp>.
               super_QVLABaseBase.s);
    if ((local_50.stream)->space == true) {
      QTextStream::operator<<(&(local_50.stream)->ts,' ');
    }
    QDebug::~QDebug(&local_50);
  }
  this->activeBufferOpCount = 0;
  this->activeTextureOpCount = 0;
  bVar4 = (byte)this->poolIndex & 0x3f;
  pqVar1 = &this->rhi->resUpdPoolMap;
  *pqVar1 = *pqVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
  this->poolIndex = -1;
  std::_Destroy_n_aux<false>::__destroy_n<QRhiResourceUpdateBatchPrivate::TextureOp*,long_long>
            ((TextureOp *)
             (this->textureOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::TextureOp>.
             super_QVLABaseBase.ptr,
             (this->textureOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::TextureOp>.
             super_QVLABaseBase.s);
  (this->textureOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::TextureOp>.super_QVLABaseBase.s
       = 0;
  if (0x100000 < uVar7) {
    lVar2 = (this->bufferOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>.
            super_QVLABaseBase.s;
    if (0 < lVar2) {
      uVar10 = lVar2 + 1;
      this_00 = (QRhiBufferData *)
                ((long)(this->bufferOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>.
                       super_QVLABaseBase.ptr + 0x18);
      do {
        QRhiBufferData::~QRhiBufferData(this_00);
        uVar10 = uVar10 - 1;
        this_00 = this_00 + 6;
      } while (1 < uVar10);
    }
    (this->bufferOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>.super_QVLABaseBase.s
         = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiResourceUpdateBatchPrivate::free()
{
    Q_ASSERT(poolIndex >= 0 && rhi->resUpdPool[poolIndex] == q);

    quint32 bufferDataTotal = 0;
    quint32 bufferLargeAllocTotal = 0;
    for (const BufferOp &op : std::as_const(bufferOps)) {
        bufferDataTotal += op.data.size();
        bufferLargeAllocTotal += op.data.largeAlloc(); // alloc when > 1 KB
    }

    if (QRHI_LOG_RUB().isDebugEnabled()) {
        qDebug() << "[rub] release to pool upd.batch #" << poolIndex
                << "/ bufferOps active" << activeBufferOpCount
                << "of" << bufferOps.count()
                << "data" << bufferDataTotal
                << "largeAlloc" << bufferLargeAllocTotal
                << "textureOps active" << activeTextureOpCount
                << "of" << textureOps.count();
    }

    activeBufferOpCount = 0;
    activeTextureOpCount = 0;

    const quint64 mask = 1ULL << quint64(poolIndex);
    rhi->resUpdPoolMap &= ~mask;
    poolIndex = -1;

    // textureOps is cleared, to not keep the potentially large image pixel
    // data alive, but it is expected that the container keeps the list alloc
    // at least. Only trimOpList() goes for the more aggressive route with squeeze.
    textureOps.clear();

    // bufferOps is not touched in many cases, to allow reusing allocations
    // (incl. in the elements' QRhiBufferData) as much as possible when this
    // batch is used again in the future, which is important for performance, in
    // particular with Qt Quick where it is easy for scenes to produce lots of,
    // typically small buffer changes on every frame.
    //
    // However, ensure that even in the unlikely case of having the max number
    // of batches (64) created in resUpdPool, no more than 64 MB in total is
    // used up by buffer data just to help future reuse. For simplicity, if
    // there is more than 1 MB data -> clear. Applications with frequent, huge
    // buffer updates probably have other bottlenecks anyway.
    if (bufferLargeAllocTotal > 1024 * 1024)
        bufferOps.clear();
}